

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O2

int WebRtcVad_set_mode(VadInst *handle,int mode)

{
  VadInstT *self;
  
  if ((handle != (VadInst *)0x0) && (*(int *)(handle + 0x2dc) == 0x2a)) {
    switch(mode) {
    case 0:
      *(undefined2 *)(handle + 0x2c8) = 3;
      *(undefined4 *)(handle + 0x2c4) = 0x40008;
      *(undefined4 *)(handle + 0x2ca) = 0x7000e;
      *(undefined2 *)(handle + 0x2ce) = 5;
      *(undefined4 *)(handle + 0x2d0) = 0x150018;
      *(undefined2 *)(handle + 0x2d4) = 0x18;
      *(undefined4 *)(handle + 0x2d6) = 0x300039;
      *(undefined2 *)(handle + 0x2da) = 0x39;
      break;
    case 1:
      *(undefined2 *)(handle + 0x2c8) = 3;
      *(undefined4 *)(handle + 0x2c4) = 0x40008;
      *(undefined4 *)(handle + 0x2ca) = 0x7000e;
      *(undefined2 *)(handle + 0x2ce) = 5;
      *(undefined4 *)(handle + 0x2d0) = 0x200025;
      *(undefined2 *)(handle + 0x2d4) = 0x25;
      *(undefined4 *)(handle + 0x2d6) = 0x500064;
      *(undefined2 *)(handle + 0x2da) = 100;
      break;
    case 2:
      *(undefined2 *)(handle + 0x2c8) = 2;
      *(undefined4 *)(handle + 0x2c4) = 0x30006;
      *(undefined4 *)(handle + 0x2ca) = 0x50009;
      *(undefined2 *)(handle + 0x2ce) = 3;
      *(undefined4 *)(handle + 0x2d0) = 0x4e0052;
      *(undefined2 *)(handle + 0x2d4) = 0x52;
      *(undefined4 *)(handle + 0x2d6) = 0x104011d;
      *(undefined2 *)(handle + 0x2da) = 0x11d;
      break;
    case 3:
      *(undefined2 *)(handle + 0x2c8) = 2;
      *(undefined4 *)(handle + 0x2c4) = 0x30006;
      *(undefined4 *)(handle + 0x2ca) = 0x50009;
      *(undefined2 *)(handle + 0x2ce) = 3;
      *(undefined4 *)(handle + 0x2d0) = 0x5e005e;
      *(undefined2 *)(handle + 0x2d4) = 0x5e;
      *(undefined4 *)(handle + 0x2d6) = 0x41a044c;
      *(undefined2 *)(handle + 0x2da) = 0x44c;
      break;
    default:
      return -1;
    }
    return 0;
  }
  return -1;
}

Assistant:

int WebRtcVad_set_mode(VadInst* handle, int mode) {
  VadInstT* self = (VadInstT*) handle;

  if (handle == NULL) {
    return -1;
  }
  if (self->init_flag != kInitCheck) {
    return -1;
  }

  return WebRtcVad_set_mode_core(self, mode);
}